

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall
ktx::ValidationContext::validateKTXwriterScParams
          (ValidationContext *this,uint8_t *data,uint32_t size)

{
  bool bVar1;
  undefined4 in_register_00000014;
  char *end;
  char *extraout_RDX;
  char *extraout_RDX_00;
  int iVar2;
  const_iterator it;
  char **local_30;
  undefined1 local_28;
  
  end = (char *)CONCAT44(in_register_00000014,size);
  this->foundKTXwriterScParams = true;
  if ((size == 0) || (data[size - 1] != '\0')) {
    error<>(this,&Metadata::KTXwriterScParamsMissingNull);
    iVar2 = 0;
    end = extraout_RDX;
  }
  else {
    iVar2 = -1;
  }
  local_30 = (char **)data;
  do {
    if (local_30 == (char **)(data + (iVar2 + size))) {
      return;
    }
    bVar1 = advanceUTF8<char_const*>((ktx *)&local_30,(char **)(data + (iVar2 + size)),end);
    end = extraout_RDX_00;
  } while (bVar1);
  local_30 = (char **)((long)local_30 - (long)data);
  local_28 = 1;
  error<unsigned_long&>(this,&Metadata::KTXwriterScParamsInvalidUTF8,(unsigned_long *)&local_30);
  return;
}

Assistant:

void ValidationContext::validateKTXwriterScParams(const uint8_t* data, uint32_t size) {
    foundKTXwriterScParams = true;

    const auto hasNull = size > 0 && data[size - 1] == '\0';
    if (!hasNull)
        error(Metadata::KTXwriterScParamsMissingNull);

    const auto value = std::string_view(reinterpret_cast<const char*>(data), hasNull ? size - 1 : size);
    if (auto invalidIndex = validateUTF8(value))
        error(Metadata::KTXwriterScParamsInvalidUTF8, *invalidIndex);
}